

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_color(nk_context *ctx,nk_color color,nk_vec2 size)

{
  float fVar1;
  nk_window *win_00;
  nk_rect rect;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect header_00;
  nk_widget_layout_states nVar2;
  int iVar3;
  float fVar4;
  nk_context *local_98;
  nk_symbol_type local_8c;
  nk_symbol_type sym;
  nk_rect bounds;
  nk_rect button;
  nk_rect content;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_context *ctx_local;
  nk_vec2 size_local;
  nk_color color_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6074,
                  "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.y = 0.0;
      }
      else {
        win_00 = ctx->current;
        nVar2 = nk_widget((nk_rect *)&s,ctx);
        if (nVar2 == NK_WIDGET_INVALID) {
          size_local.y = 0.0;
        }
        else {
          if (((win_00->layout->flags & 0x1000) != 0) || (local_98 = ctx, nVar2 == NK_WIDGET_ROM)) {
            local_98 = (nk_context *)0x0;
          }
          header._8_8_ = local_98;
          r.y = (float)is_clicked;
          r.x = (float)s;
          r.w = header.x;
          r.h = header.y;
          iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&local_98->input,NK_BUTTON_DEFAULT);
          background._4_4_ = (uint)(iVar3 != 0);
          if ((ctx->last_widget_state & 0x20) == 0) {
            if ((ctx->last_widget_state & 0x10) == 0) {
              content._8_8_ = &(ctx->style).combo;
            }
            else {
              content._8_8_ = &(ctx->style).combo.hover;
            }
          }
          else {
            content._8_8_ = &(ctx->style).combo.active;
          }
          if (*(int *)content._8_8_ == 1) {
            r_00.y = (float)is_clicked;
            r_00.x = (float)s;
            r_00.w = header.x;
            r_00.h = header.y;
            nk_draw_image(&win_00->buffer,r_00,(nk_image *)(content._8_8_ + 8),(nk_color)0xffffffff)
            ;
          }
          else {
            rect_00.y = (float)is_clicked;
            rect_00.x = (float)s;
            rect_00.w = header.x;
            rect_00.h = header.y;
            nk_fill_rect(&win_00->buffer,rect_00,(ctx->style).combo.rounding,
                         *(nk_color *)(content._8_8_ + 8));
            rect_01.y = (float)is_clicked;
            rect_01.x = (float)s;
            rect_01.w = header.x;
            rect_01.h = header.y;
            nk_stroke_rect(&win_00->buffer,rect_01,(ctx->style).combo.rounding,
                           (ctx->style).combo.border,(ctx->style).combo.border_color);
          }
          if ((ctx->last_widget_state & 0x10) == 0) {
            if (background._4_4_ == 0) {
              local_8c = (ctx->style).combo.sym_normal;
            }
            else {
              local_8c = (ctx->style).combo.sym_active;
            }
          }
          else {
            local_8c = (ctx->style).combo.sym_hover;
          }
          fVar1 = (ctx->style).combo.button_padding.y;
          button.x = header.y - (fVar1 + fVar1);
          bounds.w = (((float)s + header.x) - header.y) - (ctx->style).combo.button_padding.x;
          bounds.h = (float)is_clicked + (ctx->style).combo.button_padding.y;
          button.w = bounds.w + (ctx->style).combo.button.padding.x;
          button.h = bounds.h + (ctx->style).combo.button.padding.y;
          bounds.y = (ctx->style).combo.content_padding.y * -4.0 + header.y;
          fVar1 = (ctx->style).combo.content_padding.y;
          fVar4 = (ctx->style).combo.content_padding.x;
          fVar4 = fVar4 + fVar4 + (float)s;
          bounds.x = (bounds.w -
                     ((ctx->style).combo.content_padding.x + (ctx->style).combo.spacing.x)) - fVar4;
          rect.y = fVar1 + fVar1 + (float)is_clicked;
          rect.x = fVar4;
          rect.w = bounds.x;
          rect.h = bounds.y;
          button.y = button.x;
          nk_fill_rect(&win_00->buffer,rect,0.0,color);
          nk_draw_button_symbol
                    (&win_00->buffer,(nk_rect *)&bounds.w,(nk_rect *)&button.w,
                     ctx->last_widget_state,&(ctx->style).combo.button,local_8c,(ctx->style).font);
          header_00.y = (float)is_clicked;
          header_00.x = (float)s;
          header_00.w = header.x;
          header_00.h = header.y;
          size_local.y = (float)nk_combo_begin(ctx,win_00,size,background._4_4_,header_00);
        }
      }
      return (int)size_local.y;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6076,
                  "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x6075,
                "int nk_combo_begin_color(struct nk_context *, struct nk_color, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo_begin_color(struct nk_context *ctx, struct nk_color color, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED)
        background = &style->combo.active;
    else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        background = &style->combo.hover;
    else background = &style->combo.normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, header, &background->data.image,nk_white);
    } else {
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect bounds;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw color */
        bounds.h = header.h - 4 * style->combo.content_padding.y;
        bounds.y = header.y + 2 * style->combo.content_padding.y;
        bounds.x = header.x + 2 * style->combo.content_padding.x;
        bounds.w = (button.x - (style->combo.content_padding.x + style->combo.spacing.x)) - bounds.x;
        nk_fill_rect(&win->buffer, bounds, 0, color);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}